

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasn_dec.cc
# Opt level: O1

int asn1_d2i_ex_primitive
              (ASN1_VALUE **pval,uchar **in,long inlen,ASN1_ITEM *it,int tag,int aclass,char opt)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  ASN1_OBJECT *a;
  ASN1_INTEGER *pAVar4;
  ASN1_OBJECT *pAVar5;
  char ***a_00;
  int iVar6;
  uint uVar7;
  ASN1_OBJECT **ppAVar8;
  byte *length;
  char cst;
  uint local_74;
  ASN1_OBJECT **local_70;
  CBS cbs;
  uchar oclass;
  byte *local_50;
  uchar **local_48;
  uint32_t c;
  long plen;
  
  if (it->itype == '\0') {
    uVar7 = it->utype;
  }
  else {
    uVar7 = tag;
    tag = 0xffffffff;
    if (it->itype != '\x05') {
      __assert_fail("it->itype == ASN1_ITYPE_PRIMITIVE || it->itype == ASN1_ITYPE_MSTRING",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_dec.cc"
                    ,0x275,
                    "int asn1_d2i_ex_primitive(ASN1_VALUE **, const unsigned char **, long, const ASN1_ITEM *, int, int, char)"
                   );
    }
  }
  local_74 = uVar7;
  if (uVar7 + 5 < 2) {
    if (-1 < tag) {
      iVar3 = 0x89;
      iVar6 = 0x281;
LAB_003139de:
      ERR_put_error(0xc,0,iVar3,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_dec.cc"
                    ,iVar6);
      return 0;
    }
    if (opt != '\0') {
      iVar3 = 0x87;
      iVar6 = 0x285;
      goto LAB_003139de;
    }
    local_50 = *in;
    local_70 = (ASN1_OBJECT **)pval;
    local_48 = in;
    iVar3 = asn1_check_tlen(&plen,(int *)&local_74,&oclass,&cst,&local_50,inlen,-1,0,'\0');
    if (iVar3 == 0) {
      iVar3 = 0x9e;
      iVar6 = 0x28c;
      goto LAB_003139de;
    }
    if (((oclass != '\0') || (0x1e < local_74)) || ((0x5fff147eU >> (local_74 & 0x1f) & 1) == 0)) {
      local_74 = 0xfffffffd;
    }
    in = local_48;
    pval = (ASN1_VALUE **)local_70;
    if (((uVar7 == 0xfffffffb) && (local_74 < 7)) && ((0x62U >> (local_74 & 0x1f) & 1) != 0)) {
      if (cst != '\0') {
        iVar3 = 0xb3;
        iVar6 = 0x297;
        goto LAB_003139de;
      }
      cbs.data = local_50;
      cbs.len = plen;
      if ((local_74 == 6) && (iVar3 = CBS_is_valid_asn1_oid(&cbs), iVar3 == 0)) {
        iVar3 = 0x92;
        iVar6 = 0x29d;
        goto LAB_003139de;
      }
      if ((local_74 == 5) && (cbs.len != 0)) {
        iVar3 = 0xa4;
        iVar6 = 0x2a1;
        goto LAB_003139de;
      }
      if (local_74 == 1) {
        if (cbs.len != 1) {
          iVar3 = 0x6a;
          iVar6 = 0x2a6;
          goto LAB_003139de;
        }
        if (1 < (byte)(*cbs.data + 1)) {
          iVar3 = 0x6d;
          iVar6 = 0x2ab;
          goto LAB_003139de;
        }
      }
      local_74 = 0xfffffffd;
      in = local_48;
      pval = (ASN1_VALUE **)local_70;
    }
  }
  if (tag == 0xffffffff) {
    aclass = 0;
    tag = local_74;
  }
  local_50 = *in;
  local_48 = in;
  iVar3 = asn1_check_tlen(&plen,(int *)0x0,(uchar *)0x0,&cst,&local_50,inlen,tag,aclass,opt);
  uVar7 = local_74;
  if (iVar3 == -1) {
    return -1;
  }
  if (iVar3 == 0) {
    iVar3 = 0x9e;
    iVar6 = 0x2ba;
LAB_00313caa:
    ERR_put_error(0xc,0,iVar3,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_dec.cc"
                  ,iVar6);
    return 0;
  }
  uVar1 = local_74 + 3;
  if ((uVar1 < 0x15) && ((0x180001U >> (uVar1 & 0x1f) & 1) != 0)) {
    if ((local_74 != 0xfffffffd) && (cst == '\0')) {
      iVar3 = 0xb2;
      iVar6 = 0x2c5;
      goto LAB_00313caa;
    }
    _oclass = *local_48;
    length = local_50 + (plen - (long)*local_48);
  }
  else {
    _oclass = local_50;
    length = (byte *)plen;
    if (cst != '\0') {
      iVar3 = 0xb3;
      iVar6 = 0x2d0;
      goto LAB_00313caa;
    }
  }
  local_50 = local_50 + plen;
  if (it->funcs != (void *)0x0) {
    __assert_fail("it->funcs == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_dec.cc"
                  ,0x2ef,
                  "int asn1_ex_c2i(ASN1_VALUE **, const unsigned char *, long, int, const ASN1_ITEM *)"
                 );
  }
  if (it->utype == -4) {
    a = (ASN1_OBJECT *)*pval;
    if (a == (ASN1_OBJECT *)0x0) {
      a = (ASN1_OBJECT *)ASN1_TYPE_new();
      if (a == (ASN1_OBJECT *)0x0) {
        bVar2 = true;
        ppAVar8 = (ASN1_OBJECT **)0x0;
        a = (ASN1_OBJECT *)0x0;
        goto LAB_00314020;
      }
      *pval = (ASN1_VALUE *)a;
    }
    if (*(uint *)&a->sn != uVar7) {
      ASN1_TYPE_set((ASN1_TYPE *)a,uVar7,(void *)0x0);
    }
    a_00 = &a->ln;
    ppAVar8 = (ASN1_OBJECT **)pval;
  }
  else {
    ppAVar8 = (ASN1_OBJECT **)0x0;
    a = (ASN1_OBJECT *)0x0;
    a_00 = (char ***)pval;
  }
  switch(uVar1) {
  case 0:
  case 7:
  case 0xf:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x1d:
  case 0x1e:
  case 0x1f:
  case 0x21:
    cbs.data = _oclass;
    cbs.len = (size_t)length;
    switch(uVar7) {
    case 0x17:
switchD_00313d08_caseD_17:
      iVar3 = CBS_parse_utc_time(&cbs,(tm *)0x0,1);
      if (iVar3 == 0) {
        iVar3 = 0x94;
        iVar6 = 0x361;
        goto LAB_00313fd5;
      }
      if (uVar7 == 0x18) goto switchD_00313d08_caseD_18;
      break;
    case 0x18:
      goto switchD_00313d08_caseD_18;
    case 0x19:
    case 0x1a:
    case 0x1b:
    case 0x1d:
      break;
    case 0x1c:
switchD_00313d08_caseD_1c:
      local_70 = ppAVar8;
      if (cbs.len != 0) {
        do {
          iVar3 = CBS_get_utf32_be(&cbs,&c);
          if (iVar3 == 0) {
            iVar3 = 0x95;
            iVar6 = 0x351;
            goto LAB_00314010;
          }
        } while (cbs.len != 0);
      }
      ppAVar8 = local_70;
      if (uVar7 != 0x18) {
        if (uVar7 != 0x17) goto switchD_00313d08_default;
        goto switchD_00313d08_caseD_17;
      }
switchD_00313d08_caseD_18:
      iVar3 = CBS_parse_generalized_time(&cbs,(tm *)0x0,0);
      if (iVar3 == 0) {
        iVar3 = 0x94;
        iVar6 = 0x368;
        goto LAB_00313fd5;
      }
      break;
    case 0x1e:
      local_70 = ppAVar8;
      if (length != (byte *)0x0) {
        do {
          iVar3 = CBS_get_ucs2_be(&cbs,&c);
          if (iVar3 == 0) {
            iVar3 = 0x8e;
            iVar6 = 0x348;
            goto LAB_00314010;
          }
        } while (cbs.len != 0);
      }
      ppAVar8 = local_70;
      if ((int)uVar7 < 0x18) {
        if (uVar7 == 0xc) goto LAB_00313d62;
LAB_00313e08:
        ppAVar8 = local_70;
        if (uVar7 == 0x17) goto switchD_00313d08_caseD_17;
      }
      else {
        if (uVar7 == 0x18) goto switchD_00313d08_caseD_18;
        if (uVar7 == 0x1c) goto switchD_00313d08_caseD_1c;
      }
      break;
    default:
switchD_00313d08_default:
      if (uVar7 == 0xc) {
LAB_00313d62:
        local_70 = ppAVar8;
        if (cbs.len != 0) {
LAB_00313d7c:
          iVar3 = CBS_get_utf8(&cbs,&c);
          if (iVar3 != 0) goto code_r0x00313d8f;
          iVar3 = 0x96;
          iVar6 = 0x35a;
LAB_00314010:
          ERR_put_error(0xc,0,iVar3,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_dec.cc"
                        ,iVar6);
          ppAVar8 = local_70;
          goto LAB_0031401d;
        }
LAB_00313d97:
        ppAVar8 = local_70;
        if (uVar7 != 0x18) goto LAB_00313e08;
        goto switchD_00313d08_caseD_18;
      }
    }
    pAVar5 = (ASN1_OBJECT *)*a_00;
    if (pAVar5 == (ASN1_OBJECT *)0x0) {
      pAVar5 = (ASN1_OBJECT *)ASN1_STRING_type_new(uVar7);
      if (pAVar5 != (ASN1_OBJECT *)0x0) {
        *a_00 = (char **)pAVar5;
        goto LAB_00313f7a;
      }
      goto LAB_0031401d;
    }
    *(uint *)((long)&pAVar5->sn + 4) = uVar7;
LAB_00313f7a:
    iVar3 = ASN1_STRING_set((ASN1_STRING *)pAVar5,_oclass,(int)length);
    if (iVar3 == 0) {
      ASN1_STRING_free((ASN1_STRING *)pAVar5);
      *a_00 = (char **)0x0;
      goto LAB_0031401d;
    }
    goto LAB_00313f8e;
  default:
    iVar3 = 0xc1;
    iVar6 = 0x382;
    break;
  case 4:
    if (length != (byte *)0x1) {
      iVar3 = 0x6a;
      iVar6 = 0x318;
      break;
    }
    *(uint *)a_00 = (uint)*_oclass;
    goto LAB_00313f8e;
  case 5:
  case 0xd:
    pAVar4 = c2i_ASN1_INTEGER((ASN1_INTEGER **)a_00,(uchar **)&oclass,(long)length);
    if (pAVar4 != (ASN1_INTEGER *)0x0) {
      *(uint *)((long)&((ASN1_OBJECT *)*a_00)->sn + 4) =
           *(uint *)((long)&((ASN1_OBJECT *)*a_00)->sn + 4) & 0x100 | uVar7;
      goto LAB_00313f8e;
    }
    goto LAB_0031401d;
  case 6:
    pAVar5 = (ASN1_OBJECT *)
             c2i_ASN1_BIT_STRING((ASN1_BIT_STRING **)a_00,(uchar **)&oclass,(long)length);
    goto LAB_00313f23;
  case 8:
    if (length == (byte *)0x0) {
      *a_00 = (char **)0x1;
      goto LAB_00313f8e;
    }
    iVar3 = 0xa4;
    iVar6 = 0x310;
    break;
  case 9:
    pAVar5 = c2i_ASN1_OBJECT((ASN1_OBJECT **)a_00,(uchar **)&oclass,(long)length);
LAB_00313f23:
    if (pAVar5 != (ASN1_OBJECT *)0x0) {
LAB_00313f8e:
      if (uVar7 == 5 && a != (ASN1_OBJECT *)0x0) {
        a->ln = (char **)0x0;
      }
      bVar2 = false;
      goto LAB_00314020;
    }
    goto LAB_0031401d;
  }
LAB_00313fd5:
  ERR_put_error(0xc,0,iVar3,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_dec.cc"
                ,iVar6);
LAB_0031401d:
  bVar2 = true;
LAB_00314020:
  if (bVar2) {
    ASN1_TYPE_free((ASN1_TYPE *)a);
    if (ppAVar8 != (ASN1_OBJECT **)0x0) {
      *ppAVar8 = (ASN1_OBJECT *)0x0;
    }
    if (bVar2) {
      return 0;
    }
  }
  *local_48 = local_50;
  return 1;
code_r0x00313d8f:
  if (cbs.len == 0) goto LAB_00313d97;
  goto LAB_00313d7c;
}

Assistant:

static int asn1_d2i_ex_primitive(ASN1_VALUE **pval, const unsigned char **in,
                                 long inlen, const ASN1_ITEM *it, int tag,
                                 int aclass, char opt) {
  int ret = 0, utype;
  long plen;
  char cst;
  const unsigned char *p;
  const unsigned char *cont = NULL;
  long len;
  if (!pval) {
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_ILLEGAL_NULL);
    return 0;  // Should never happen
  }

  assert(it->itype == ASN1_ITYPE_PRIMITIVE || it->itype == ASN1_ITYPE_MSTRING);
  if (it->itype == ASN1_ITYPE_MSTRING) {
    utype = tag;
    tag = -1;
  } else {
    utype = it->utype;
  }

  if (utype == V_ASN1_ANY || utype == V_ASN1_ANY_AS_STRING) {
    // If type is ANY need to figure out type from tag
    unsigned char oclass;
    if (tag >= 0) {
      OPENSSL_PUT_ERROR(ASN1, ASN1_R_ILLEGAL_TAGGED_ANY);
      return 0;
    }
    if (opt) {
      OPENSSL_PUT_ERROR(ASN1, ASN1_R_ILLEGAL_OPTIONAL_ANY);
      return 0;
    }
    const int is_string = utype == V_ASN1_ANY_AS_STRING;
    p = *in;
    ret = asn1_check_tlen(&plen, &utype, &oclass, &cst, &p, inlen, -1, 0, 0);
    if (!ret) {
      OPENSSL_PUT_ERROR(ASN1, ASN1_R_NESTED_ASN1_ERROR);
      return 0;
    }
    if (!is_supported_universal_type(utype, oclass)) {
      utype = V_ASN1_OTHER;
    }
    // These three types are not represented as |ASN1_STRING|, so they must be
    // parsed separately and then treated as an opaque |V_ASN1_OTHER|.
    if (is_string && (utype == V_ASN1_OBJECT || utype == V_ASN1_NULL ||
                      utype == V_ASN1_BOOLEAN)) {
      if (cst) {
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_TYPE_NOT_PRIMITIVE);
        return 0;
      }
      CBS cbs;
      CBS_init(&cbs, p, plen);
      if (utype == V_ASN1_OBJECT && !CBS_is_valid_asn1_oid(&cbs)) {
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_INVALID_OBJECT_ENCODING);
        return 0;
      }
      if (utype == V_ASN1_NULL && CBS_len(&cbs) != 0) {
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_NULL_IS_WRONG_LENGTH);
        return 0;
      }
      if (utype == V_ASN1_BOOLEAN) {
        if (CBS_len(&cbs) != 1) {
          OPENSSL_PUT_ERROR(ASN1, ASN1_R_BOOLEAN_IS_WRONG_LENGTH);
          return 0;
        }
        uint8_t v = CBS_data(&cbs)[0];
        if (v != 0 && v != 0xff) {
          OPENSSL_PUT_ERROR(ASN1, ASN1_R_DECODE_ERROR);
          return 0;
        }
      }
      utype = V_ASN1_OTHER;
    }
  }
  if (tag == -1) {
    tag = utype;
    aclass = V_ASN1_UNIVERSAL;
  }
  p = *in;
  // Check header
  ret = asn1_check_tlen(&plen, NULL, NULL, &cst, &p, inlen, tag, aclass, opt);
  if (!ret) {
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_NESTED_ASN1_ERROR);
    return 0;
  } else if (ret == -1) {
    return -1;
  }
  ret = 0;
  // SEQUENCE, SET and "OTHER" are left in encoded form
  if ((utype == V_ASN1_SEQUENCE) || (utype == V_ASN1_SET) ||
      (utype == V_ASN1_OTHER)) {
    // SEQUENCE and SET must be constructed
    if (utype != V_ASN1_OTHER && !cst) {
      OPENSSL_PUT_ERROR(ASN1, ASN1_R_TYPE_NOT_CONSTRUCTED);
      return 0;
    }

    cont = *in;
    len = p - cont + plen;
    p += plen;
  } else if (cst) {
    // This parser historically supported BER constructed strings. We no
    // longer do and will gradually tighten this parser into a DER
    // parser. BER types should use |CBS_asn1_ber_to_der|.
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_TYPE_NOT_PRIMITIVE);
    return 0;
  } else {
    cont = p;
    len = plen;
    p += plen;
  }

  // We now have content length and type: translate into a structure
  if (!asn1_ex_c2i(pval, cont, len, utype, it)) {
    goto err;
  }

  *in = p;
  ret = 1;
err:
  return ret;
}